

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O2

void __thiscall uWS::TopicTree::drain(TopicTree *this)

{
  _Rb_tree_header *p_Var1;
  Topic *pTVar2;
  Subscriber *pSVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar10;
  Subscriber *pSVar11;
  int i_3;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  _Rb_tree_const_iterator<uWS::Subscriber_*> *this_00;
  int i;
  long lVar15;
  int i_1;
  long lVar16;
  uint local_714;
  Subscriber *local_710;
  uint64_t intersection;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  complete;
  Subscriber *local_690;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_688;
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  intersectionCache;
  iterator it [64];
  iterator end [64];
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *perSubscriberIntersectingTopicMessages [64];
  
  iVar6 = this->numTriggeredTopics;
  if (iVar6 != 0) {
    uVar13 = 0;
    for (lVar15 = 0; iVar12 = (int)uVar13, lVar15 < iVar6; lVar15 = lVar15 + 1) {
      pTVar2 = this->triggeredTopics[lVar15];
      if ((pTVar2->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear(&(pTVar2->messages)._M_t);
        this->triggeredTopics[lVar15]->triggered = false;
        iVar6 = this->numTriggeredTopics;
      }
      else {
        uVar13 = (ulong)(iVar12 + 1);
        this->triggeredTopics[iVar12] = pTVar2;
      }
    }
    this->numTriggeredTopics = iVar12;
    if (iVar12 != 0) {
      this->min = (Subscriber *)0xffffffffffffffff;
      uVar7 = 0;
      uVar14 = 0;
      if (0 < iVar12) {
        uVar14 = uVar13;
      }
      pSVar11 = (Subscriber *)0xffffffffffffffff;
      for (; uVar14 != uVar7; uVar7 = uVar7 + 1) {
        if (((this->triggeredTopics[uVar7]->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count
             != 0) &&
           (pSVar3 = *(Subscriber **)
                      (*(_Base_ptr *)
                        ((long)&(this->triggeredTopics[uVar7]->subs)._M_t._M_impl.
                                super__Rb_tree_header._M_header + 0x10) + 1), pSVar3 < pSVar11)) {
          this->min = pSVar3;
          pSVar11 = pSVar3;
        }
      }
      if (pSVar11 != (Subscriber *)0xffffffffffffffff) {
        intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header;
        intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        intersectionCache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             intersectionCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        memset(it,0,0x200);
        memset(end,0,0x200);
        for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
          pTVar2 = this->triggeredTopics[uVar7];
          it[uVar7]._M_node =
               *(_Base_ptr *)
                ((long)&(pTVar2->subs)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
          end[uVar7]._M_node = &(pTVar2->subs)._M_t._M_impl.super__Rb_tree_header._M_header;
        }
        while (local_714 = (uint)uVar13, local_714 != 0) {
          intersection = 0;
          lVar15 = 0;
          local_710 = (Subscriber *)0xffffffffffffffff;
          uVar13 = 0;
          for (lVar16 = 0; iVar6 = (int)uVar13, lVar16 < this->numTriggeredTopics;
              lVar16 = lVar16 + 1) {
            p_Var4 = *(_Base_ptr *)((long)&it[0]._M_node + lVar15);
            p_Var5 = *(_Base_ptr *)((long)&end[0]._M_node + lVar15);
            if (p_Var4 != p_Var5) {
              pSVar11 = *(Subscriber **)(p_Var4 + 1);
              if (pSVar11 == this->min) {
                this_00 = (_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                          ((long)&it[0]._M_node + lVar15);
                intersection = intersection | 1L << ((byte)lVar16 & 0x3f);
                uVar13 = (ulong)(iVar6 + 1);
                perSubscriberIntersectingTopicMessages[iVar6] =
                     (map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(*(long *)((long)this->triggeredTopics + lVar15) + 0x60);
                std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator++(this_00,0);
                p_Var4 = this_00->_M_node;
                if (p_Var4 == p_Var5) {
                  local_714 = local_714 - 1;
                }
                else {
                  pSVar11 = *(Subscriber **)(p_Var4 + 1);
                  if (pSVar11 < local_710) {
                    local_710 = pSVar11;
                  }
                }
              }
              else if (pSVar11 < local_710) {
                local_710 = pSVar11;
              }
            }
            lVar15 = lVar15 + 8;
          }
          pmVar8 = std::
                   map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&intersectionCache,&intersection);
          if ((pmVar8->first)._M_string_length == 0) {
            complete._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            complete._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            p_Var1 = &complete._M_t._M_impl.super__Rb_tree_header;
            complete._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            if (iVar6 < 1) {
              uVar13 = 0;
            }
            uVar14 = 0;
            complete._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            complete._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
            for (; uVar13 != uVar14; uVar14 = uVar14 + 1) {
              std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
              ::
              _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                        ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                          *)&complete,
                         (perSubscriberIntersectingTopicMessages[uVar14]->_M_t)._M_impl.
                         super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )&(perSubscriberIntersectingTopicMessages[uVar14]->_M_t)._M_impl.
                            super__Rb_tree_header);
            }
            res.first._M_dataplus._M_p = (pointer)&res.first.field_2;
            res.first._M_string_length = 0;
            res.first.field_2._M_allocated_capacity =
                 res.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            res.second._M_dataplus._M_p = (pointer)&res.second.field_2;
            res.second._M_string_length = 0;
            res.second.field_2._M_local_buf[0] = '\0';
            for (p_Var9 = complete._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var9 != p_Var1;
                p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
              std::__cxx11::string::append((string *)&res);
              std::__cxx11::string::append((string *)&res.second);
            }
            pSVar11 = this->min;
            pmVar8 = std::
                     map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&intersectionCache,&intersection);
            ppVar10 = std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator=(pmVar8,&res);
            local_688.first._M_str = (ppVar10->first)._M_dataplus._M_p;
            local_688.first._M_len = (ppVar10->first)._M_string_length;
            local_688.second._M_str = (ppVar10->second)._M_dataplus._M_p;
            local_688.second._M_len = (ppVar10->second)._M_string_length;
            local_690 = pSVar11;
            if ((this->cb).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->cb)._M_invoker)((_Any_data *)this,&local_690,&local_688);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&res);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~_Rb_tree(&complete._M_t);
          }
          else {
            pSVar11 = this->min;
            pmVar8 = std::
                     map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&intersectionCache,&intersection);
            res.first._M_string_length = (size_type)(pmVar8->first)._M_dataplus._M_p;
            res.first._M_dataplus._M_p = (pointer)(pmVar8->first)._M_string_length;
            res.first.field_2._8_8_ = (pmVar8->second)._M_dataplus._M_p;
            res.first.field_2._M_allocated_capacity = (pmVar8->second)._M_string_length;
            complete._M_t._M_impl._0_8_ = pSVar11;
            if ((this->cb).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->cb)._M_invoker)
                      ((_Any_data *)this,(Subscriber **)&complete,
                       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)&res);
          }
          uVar13 = (ulong)local_714;
          this->min = local_710;
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Rb_tree(&intersectionCache._M_t);
      }
      for (lVar15 = 0; lVar15 < this->numTriggeredTopics; lVar15 = lVar15 + 1) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear(&(this->triggeredTopics[lVar15]->messages)._M_t);
        this->triggeredTopics[lVar15]->triggered = false;
      }
      this->numTriggeredTopics = 0;
    }
  }
  return;
}

Assistant:

void drain() {

        /* Do nothing if nothing to send */
        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: Filter triggered topics without subscribers */
        int numFilteredTriggeredTopics = 0;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if (triggeredTopics[i]->subs.size()) {
                triggeredTopics[numFilteredTriggeredTopics++] = triggeredTopics[i];
            } else {
                /* If we no longer have any subscribers, yet still keep this Topic alive (parent),
                 * make sure to clear its potential messages. */
                triggeredTopics[i]->messages.clear();
                triggeredTopics[i]->triggered = false;
            }
        }
        numTriggeredTopics = numFilteredTriggeredTopics;

        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: update min, as the one tracked via subscribe gets invalid as you unsubscribe */
        min = (Subscriber *)UINTPTR_MAX;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if ((triggeredTopics[i]->subs.size()) && (min > *triggeredTopics[i]->subs.begin())) {
                min = *triggeredTopics[i]->subs.begin();
            }
        }

        /* Check if we really have any sockets still */
        if (min != (Subscriber *)UINTPTR_MAX) {

            /* Up to 64 triggered Topics per batch */
            std::map<uint64_t, std::pair<std::string, std::string>> intersectionCache;

            /* Loop over these here */
            std::set<Subscriber *>::iterator it[64];
            std::set<Subscriber *>::iterator end[64];
            for (int i = 0; i < numTriggeredTopics; i++) {
                it[i] = triggeredTopics[i]->subs.begin();
                end[i] = triggeredTopics[i]->subs.end();
            }
            
            /* Empty all sets from unique subscribers */
            for (int nonEmpty = numTriggeredTopics; nonEmpty; ) {

                Subscriber *nextMin = (Subscriber *)UINTPTR_MAX;

                /* The message sets relevant for this intersection */
                std::map<unsigned int, std::pair<std::string, std::string>> *perSubscriberIntersectingTopicMessages[64];
                int numPerSubscriberIntersectingTopicMessages = 0;

                uint64_t intersection = 0;

                for (int i = 0; i < numTriggeredTopics; i++) {
                    if ((it[i] != end[i]) && (*it[i] == min)) {

                        /* Mark this intersection */
                        intersection |= ((uint64_t)1 << i);
                        perSubscriberIntersectingTopicMessages[numPerSubscriberIntersectingTopicMessages++] = &triggeredTopics[i]->messages;

                        it[i]++;
                        if (it[i] == end[i]) {
                            nonEmpty--;
                        }
                        else {
                            if (nextMin > *it[i]) {
                                nextMin = *it[i];
                            }
                        }
                    }
                    else {
                        /* We need to lower nextMin to us, in the case of min being the last in a set */
                        if ((it[i] != end[i]) && (nextMin > *it[i])) {
                            nextMin = *it[i];
                        }
                    }
                }

                /* Generate cache for intersection */
                if (intersectionCache[intersection].first.length() == 0) {

                    /* Build the union in order without duplicates */
                    std::map<unsigned int, std::pair<std::string, std::string>> complete;
                    for (int i = 0; i < numPerSubscriberIntersectingTopicMessages; i++) {
                        complete.insert(perSubscriberIntersectingTopicMessages[i]->begin(), perSubscriberIntersectingTopicMessages[i]->end());
                    }

                    /* Create the linear cache, {inflated, deflated} */
                    std::pair<std::string, std::string> res;
                    for (auto &p : complete) {
                        res.first.append(p.second.first);
                        res.second.append(p.second.second);
                    }

                    cb(min, intersectionCache[intersection] = std::move(res));
                }
                else {
                    cb(min, intersectionCache[intersection]);
                }

                min = nextMin;
            }

        }

        /* Clear messages of triggered Topics */
        for (int i = 0; i < numTriggeredTopics; i++) {
            triggeredTopics[i]->messages.clear();
            triggeredTopics[i]->triggered = false;
        }
        numTriggeredTopics = 0;
    }